

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

void * Kernel::Clause::operator_new(size_t sz,uint lits)

{
  void *pvVar1;
  undefined4 in_ESI;
  size_t size;
  undefined4 in_stack_fffffffffffffff0;
  
  pvVar1 = Lib::alloc(CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return pvVar1;
}

Assistant:

void* Clause::operator new(size_t sz, unsigned lits)
{
  ASS_EQ(sz,sizeof(Clause));

  RSTAT_CTR_INC("clauses created");

  //We have to get sizeof(Clause) + (_length-1)*sizeof(Literal*)
  //this way, because _length-1 wouldn't behave well for
  //_length==0 on x64 platform.
  size_t size = sizeof(Clause) + lits * sizeof(Literal*);
  size -= sizeof(Literal*);

  return ALLOC_KNOWN(size,"Clause");
}